

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

string * __thiscall
google::protobuf::descriptor_unittest::EmbedAggregateValue_abi_cxx11_
          (string *__return_storage_ptr__,descriptor_unittest *this,char *value)

{
  string *extraout_RAX;
  size_t in_R9;
  string_view format;
  size_t local_28;
  descriptor_unittest *local_20;
  
  if (this == (descriptor_unittest *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = strlen((char *)this);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_28;
  format._M_len =
       (size_t)
       "name: \"foo.proto\" dependency: \"google/protobuf/descriptor.proto\" message_type { name: \"Foo\" } extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL             type: TYPE_MESSAGE type_name: \"Foo\"             extendee: \"google.protobuf.FileOptions\" }options { uninterpreted_option { name { name_part: \"foo\"                                         is_extension: true }                                  $0 } }"
  ;
  local_20 = this;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x19e,format,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  return extraout_RAX;
}

Assistant:

static std::string EmbedAggregateValue(const char* value) {
  return absl::Substitute(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "message_type { name: \"Foo\" } "
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_MESSAGE type_name: \"Foo\" "
      "            extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 $0 } }",
      value);
}